

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeFaceWrapper.cpp
# Opt level: O0

BoolAndFTShort __thiscall FreeTypeFaceWrapper::GetCapHeightInternal(FreeTypeFaceWrapper *this)

{
  BoolAndFTShort fontDependentResult;
  FreeTypeFaceWrapper *this_local;
  
  if (this->mFormatParticularWrapper == (IFreeTypeFaceExtender *)0x0) {
    this_local._4_4_ = CapHeightFromHHeight(this);
  }
  else {
    this_local._4_4_ =
         (BoolAndFTShort)(*this->mFormatParticularWrapper->_vptr_IFreeTypeFaceExtender[3])();
    if (((uint)this_local._4_4_ & 1) == 0) {
      this_local._4_4_ = CapHeightFromHHeight(this);
    }
  }
  return this_local._4_4_;
}

Assistant:

BoolAndFTShort FreeTypeFaceWrapper::GetCapHeightInternal()
{
	if(mFormatParticularWrapper)
	{
		BoolAndFTShort fontDependentResult = mFormatParticularWrapper->GetCapHeight();
		if(fontDependentResult.first)
			return fontDependentResult;
		else
			return CapHeightFromHHeight();

	}
	else
		return CapHeightFromHHeight();
}